

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O2

Vec3<float> __thiscall
Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(Imath_2_5 *this,Rand48 *rand)

{
  uint i;
  long lVar1;
  double dVar2;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  Vec3<float> VVar3;
  
  lVar1 = 0;
  do {
    for (; lVar1 != 3; lVar1 = lVar1 + 1) {
      dVar2 = (double)Imath_2_5::erand48(rand->_state);
      in_XMM1_Qa = 1.0 - dVar2;
      *(float *)(this + lVar1 * 4) = (float)(dVar2 - in_XMM1_Qa);
    }
    VVar3.x = Vec3<float>::length2((Vec3<float> *)this);
    VVar3.y = (float)extraout_XMM0_Db;
    lVar1 = 0;
  } while (1.0 < VVar3.x);
  VVar3.z = SUB84(in_XMM1_Qa,0);
  return VVar3;
}

Assistant:

Vec
solidSphereRand (Rand &rand)
{
    Vec v;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);
    }
    while (v.length2() > 1);

    return v;
}